

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O0

bool __thiscall QListViewPrivate::hasRectForIndex(QListViewPrivate *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QAbstractItemViewPrivate *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  byte bVar4;
  int in_stack_ffffffffffffffe4;
  QListViewPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QAbstractItemViewPrivate::isIndexValid
                    (in_RSI,(QModelIndex *)
                            CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar4 = 0;
  if (bVar2) {
    QModelIndex::parent((QModelIndex *)in_RSI);
    bVar2 = ::operator==(in_RDI,(QPersistentModelIndex *)
                                CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    bVar4 = 0;
    if (bVar2) {
      iVar3 = QModelIndex::column((QModelIndex *)in_RSI);
      bVar4 = 0;
      if (iVar3 == (int)in_RDI[0x3b].i) {
        QModelIndex::row((QModelIndex *)in_RSI);
        bVar2 = isHidden(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
        bVar4 = bVar2 ^ 0xff;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

inline bool hasRectForIndex(const QModelIndex &index) const
    {
        return isIndexValid(index) && index.parent() == root && index.column() == column && !isHidden(index.row());
    }